

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O0

Paint * __thiscall
lunasvg::parsePaint(Paint *__return_storage_ptr__,lunasvg *this,string_view input,
                   SVGLayoutState *state,Color *defaultValue)

{
  string_view input_00;
  string_view input_01;
  bool bVar1;
  Color local_80;
  undefined4 local_7c;
  SVGLayoutState *local_78;
  size_t sStack_70;
  Color local_60 [4];
  undefined1 local_50 [8];
  string id;
  Color *defaultValue_local;
  SVGLayoutState *state_local;
  string_view input_local;
  
  input_local._M_len = input._M_len;
  id.field_2._8_8_ = state;
  state_local = (SVGLayoutState *)this;
  input_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)local_50);
  bVar1 = parseUrlValue((string_view *)&state_local,(string *)local_50);
  if (bVar1) {
    bVar1 = skipOptionalSpaces((string_view *)&state_local);
    if (bVar1) {
      input_00._M_str = (char *)input_local._M_len;
      input_00._M_len = (size_t)state_local;
      local_80 = parseColorOrNone(input_00,(SVGLayoutState *)input._M_str,(Color *)id.field_2._8_8_)
      ;
      Paint::Paint(__return_storage_ptr__,(string *)local_50,&local_80);
    }
    else {
      Paint::Paint(__return_storage_ptr__,(string *)local_50,(Color *)&Color::Transparent);
    }
  }
  else {
    local_78 = state_local;
    sStack_70 = input_local._M_len;
    input_01._M_str = (char *)input_local._M_len;
    input_01._M_len = (size_t)state_local;
    local_60[0] = parseColorOrNone(input_01,(SVGLayoutState *)input._M_str,(Color *)id.field_2._8_8_
                                  );
    Paint::Paint(__return_storage_ptr__,local_60);
  }
  local_7c = 1;
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

static Paint parsePaint(std::string_view input, const SVGLayoutState* state, const Color& defaultValue)
{
    std::string id;
    if(!parseUrlValue(input, id))
        return Paint(parseColorOrNone(input, state, defaultValue));
    if(skipOptionalSpaces(input))
        return Paint(id, parseColorOrNone(input, state, defaultValue));
    return Paint(id, Color::Transparent);
}